

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

void __thiscall
ft::treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::treeBase
          (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this,
          treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *other)

{
  treeNode<int> *ptVar1;
  treeNode<int> *ptVar2;
  
  this->_vptr_treeBase = (_func_int **)&PTR__treeBase_0010dc68;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_>::RBTree(&this->m_tree);
  this->m_size = 0;
  ptVar1 = (this->m_tree).m_first;
  (this->m_tree).m_root = (this->m_tree).NIL;
  ptVar2 = (this->m_tree).m_last;
  ptVar1->parent = ptVar2;
  ptVar2->parent = ptVar1;
  return;
}

Assistant:

treeBase(treeBase const & other):
	m_tree(rbtree()),
	m_size(0),
	m_comp(other.m_comp),
	m_alloc(other.get_allocator()) {
		this->treeInit();
	}